

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

void __thiscall
llvm::yaml::Scanner::saveSimpleKeyCandidate
          (Scanner *this,iterator Tok,uint AtColumn,bool IsRequired)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  
  if (this->IsSimpleKeyAllowed == true) {
    uVar1 = this->Line;
    uVar2 = this->FlowLevel;
    if ((this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
        super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
        super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
        super_SmallVectorBase.Capacity <=
        (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
        super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
        super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
        super_SmallVectorBase.Size) {
      SmallVectorBase::grow_pod
                ((SmallVectorBase *)&this->SimpleKeys,
                 &(this->SimpleKeys).super_SmallVectorStorage<(anonymous_namespace)::SimpleKey,_4U>,
                 0,0x18);
    }
    pvVar3 = (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
             super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
             super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
             super_SmallVectorBase.BeginX;
    uVar4 = (ulong)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                   super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                   super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                   super_SmallVectorBase.Size;
    ((iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
      *)((long)pvVar3 + uVar4 * 0x18))->I =
         (ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
          )Tok.
           super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
           .I.NodePtr;
    *(uint *)((long)pvVar3 + uVar4 * 0x18 + 8) = AtColumn;
    *(uint *)((long)pvVar3 + uVar4 * 0x18 + 0xc) = uVar1;
    *(uint *)((long)pvVar3 + uVar4 * 0x18 + 0x10) = uVar2;
    *(bool *)((long)pvVar3 + uVar4 * 0x18 + 0x14) = IsRequired;
    uVar1 = (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
            super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
            super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
            super_SmallVectorBase.Size;
    if ((this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
        super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
        super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
        super_SmallVectorBase.Capacity <= uVar1) {
      __assert_fail("Size <= capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
    }
    (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
    super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
    super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.
    Size = uVar1 + 1;
  }
  return;
}

Assistant:

void Scanner::saveSimpleKeyCandidate( TokenQueueT::iterator Tok
                                    , unsigned AtColumn
                                    , bool IsRequired) {
  if (IsSimpleKeyAllowed) {
    SimpleKey SK;
    SK.Tok = Tok;
    SK.Line = Line;
    SK.Column = AtColumn;
    SK.IsRequired = IsRequired;
    SK.FlowLevel = FlowLevel;
    SimpleKeys.push_back(SK);
  }
}